

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_geom::load_d3d7(xr_level_geom *this,xr_reader *r)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer this_00;
  size_t n;
  iterator iStack_28;
  uint32_t fvf;
  xr_vbuf_vec_it end;
  xr_vbuf_vec_it it;
  xr_reader *r_local;
  xr_level_geom *this_local;
  
  uVar2 = xr_reader::r_u32(r);
  std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
            (&this->m_vbufs,(ulong)uVar2);
  end._M_current =
       (xr_vbuf *)
       std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::begin(&this->m_vbufs);
  iStack_28 = std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::end(&this->m_vbufs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    uVar2 = xr_reader::r_u32(r);
    uVar3 = xr_reader::r_u32(r);
    this_00 = __gnu_cxx::
              __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
              ::operator->(&end);
    xr_vbuf::load_d3d7(this_00,r,(ulong)uVar3,uVar2);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

void xr_level_geom::load_d3d7(xr_reader& r)
{
	m_vbufs.resize(r.r_u32());
	for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
		uint32_t fvf = r.r_u32();
		size_t n = r.r_u32();
		it->load_d3d7(r, n, fvf);
	}
}